

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O0

QPalette __thiscall QGraphicsWidgetPrivate::naturalWidgetPalette(QGraphicsWidgetPrivate *this)

{
  QGraphicsWidget *pQVar1;
  undefined8 extraout_RDX;
  QGraphicsWidgetPrivate *in_RSI;
  QGraphicsWidget *in_RDI;
  long in_FS_OFFSET;
  QPalette QVar2;
  QGraphicsWidget *parent;
  QGraphicsWidget *q;
  QPalette *palette;
  QGraphicsWidget *this_00;
  QPalette local_28;
  QPalette local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  pQVar1 = q_func(in_RSI);
  *(QPalettePrivate **)&this_00->super_QGraphicsObject = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this_00->super_QGraphicsObject).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  QPalette::QPalette((QPalette *)this_00);
  pQVar1 = QGraphicsItem::parentWidget((QGraphicsItem *)pQVar1);
  if (pQVar1 == (QGraphicsWidget *)0x0) {
    if ((in_RSI->super_QGraphicsItemPrivate).scene != (QGraphicsScene *)0x0) {
      QGraphicsScene::palette((QGraphicsScene *)this_00);
      QPalette::operator=((QPalette *)in_RSI,(QPalette *)in_RDI);
      QPalette::~QPalette(&local_28);
    }
  }
  else {
    QGraphicsWidget::palette(this_00);
    QPalette::operator=((QPalette *)in_RSI,(QPalette *)in_RDI);
    QPalette::~QPalette(&local_18);
  }
  QPalette::setResolveMask((ulonglong)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    QVar2._8_8_ = extraout_RDX;
    QVar2.d = (QPalettePrivate *)in_RDI;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QPalette QGraphicsWidgetPrivate::naturalWidgetPalette() const
{
    Q_Q(const QGraphicsWidget);
    QPalette palette;
    if (QGraphicsWidget *parent = q->parentWidget()) {
        palette = parent->palette();
    } else if (scene) {
        palette = scene->palette();
    }
    palette.setResolveMask(0);
    return palette;
}